

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

_Bool MatrixSetElement(Matrix *a,uint32_t rows,uint32_t columns,Real value)

{
  _Bool _Var1;
  
  if ((rows < a->rows) && (columns < a->columns)) {
    *(unkbyte10 *)(a->matrix + (a->columns * rows + columns)) = value._0_10_;
    _Var1 = true;
  }
  else {
    _Var1 = false;
    fprintf(_stderr,"%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n","MatrixSetElement");
  }
  return _Var1;
}

Assistant:

bool MatrixSetElement(Matrix *a, uint32_t rows, uint32_t columns, Real value) {
#ifndef NDEBUG
  if (a->rows <= rows || a->columns <= columns) {
    fprintf(stderr, "%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n", __FUNCTION_NAME__, rows, a->rows, columns, a->columns);
    return false;
  }
#endif
  a->matrix[columns + a->columns * rows] = value;
  return true;
}